

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

bool CoreML::hasIOS14Features(Model *model)

{
  bool bVar1;
  TypeCase TVar2;
  uint32 uVar3;
  Pipeline *pPVar4;
  RepeatedPtrField<CoreML::Specification::Model> *pRVar5;
  reference pMVar6;
  PipelineRegressor *this;
  PipelineClassifier *this_00;
  WordTagger *this_01;
  bool local_88;
  bool local_87;
  bool local_86;
  bool local_85;
  Model *m_2;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  RepeatedPtrField<CoreML::Specification::Model> *__range2_2;
  Model *m_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  RepeatedPtrField<CoreML::Specification::Model> *__range2_1;
  Model *m;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<CoreML::Specification::Model> *__range2;
  bool result;
  Model *model_local;
  
  __range2._7_1_ = false;
  TVar2 = Specification::Model::Type_case(model);
  if (TVar2 == kPipelineClassifier) {
    this_00 = Specification::Model::pipelineclassifier(model);
    pPVar4 = Specification::PipelineClassifier::pipeline(this_00);
    pRVar5 = Specification::Pipeline::models(pPVar4);
    __end2_2 = google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::begin(pRVar5);
    m_2 = (Model *)google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::end(pRVar5);
    while (bVar1 = google::protobuf::internal::
                   RepeatedPtrIterator<const_CoreML::Specification::Model>::operator!=
                             (&__end2_2,(iterator *)&m_2), bVar1) {
      pMVar6 = google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::Model>::
               operator*(&__end2_2);
      local_87 = true;
      if (__range2._7_1_ == false) {
        local_87 = hasIOS14Features(pMVar6);
      }
      __range2._7_1_ = local_87;
      if (local_87 != false) {
        return true;
      }
      google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::Model>::
      operator++(&__end2_2);
    }
  }
  else if (TVar2 == kPipelineRegressor) {
    this = Specification::Model::pipelineregressor(model);
    pPVar4 = Specification::PipelineRegressor::pipeline(this);
    pRVar5 = Specification::Pipeline::models(pPVar4);
    __end2_1 = google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::begin(pRVar5);
    m_1 = (Model *)google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::end(pRVar5);
    while (bVar1 = google::protobuf::internal::
                   RepeatedPtrIterator<const_CoreML::Specification::Model>::operator!=
                             (&__end2_1,(iterator *)&m_1), bVar1) {
      pMVar6 = google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::Model>::
               operator*(&__end2_1);
      local_86 = true;
      if (__range2._7_1_ == false) {
        local_86 = hasIOS14Features(pMVar6);
      }
      __range2._7_1_ = local_86;
      if (local_86 != false) {
        return true;
      }
      google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::Model>::
      operator++(&__end2_1);
    }
  }
  else {
    if (TVar2 != kPipeline) {
      if (TVar2 == kWordTagger) {
        this_01 = Specification::Model::wordtagger(model);
        uVar3 = Specification::CoreMLModels::WordTagger::revision(this_01);
        return uVar3 == 3;
      }
      if (TVar2 != kSerializedModel) {
        bVar1 = hasIOS14NeuralNetworkFeatures(model);
        local_88 = true;
        if (!bVar1) {
          bVar1 = hasObjectPrint(model);
          local_88 = true;
          if (!bVar1) {
            local_88 = hasFloat32InputsOrOutputsForNonmaxSuppression(model);
          }
        }
        return local_88;
      }
      return true;
    }
    pPVar4 = Specification::Model::pipeline(model);
    pRVar5 = Specification::Pipeline::models(pPVar4);
    __end2 = google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::begin(pRVar5);
    m = (Model *)google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::end(pRVar5);
    while (bVar1 = google::protobuf::internal::
                   RepeatedPtrIterator<const_CoreML::Specification::Model>::operator!=
                             (&__end2,(iterator *)&m), bVar1) {
      pMVar6 = google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::Model>::
               operator*(&__end2);
      local_85 = true;
      if (__range2._7_1_ == false) {
        local_85 = hasIOS14Features(pMVar6);
      }
      __range2._7_1_ = local_85;
      if (local_85 != false) {
        return true;
      }
      google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::Model>::
      operator++(&__end2);
    }
  }
  return false;
}

Assistant:

bool CoreML::hasIOS14Features(const Specification::Model& model) {
    // New IOS14 features:
    // - new layers in Neural Network
    // - Non-zero values for optional inputs
    // - VisionFeaturePrint.Object
    // - Float32 input/output for Non-Maximum Suppression
    // - Apple Word Tagger using transfer learning (revision == 3)

    bool result = false;

    switch (model.Type_case()) {
        case Specification::Model::kPipeline:
            for (auto &m : model.pipeline().models()) {
                result = result || hasIOS14Features(m);
                if (result) {
                    return true;
                }
            }
            break;
        case Specification::Model::kPipelineRegressor:
            for (auto &m : model.pipelineregressor().pipeline().models()) {
                result = result || hasIOS14Features(m);
                if (result) {
                    return true;
                }
            }
            break;
        case Specification::Model::kPipelineClassifier:
            for (auto &m : model.pipelineclassifier().pipeline().models()) {
                result = result || hasIOS14Features(m);
                if (result) {
                    return true;
                }
            }
            break;
        case Specification::Model::kSerializedModel:
            return true;
        case Specification::Model::kWordTagger:
            return model.wordtagger().revision() == 3;
        default:
            return (hasIOS14NeuralNetworkFeatures(model) || hasObjectPrint(model) || hasFloat32InputsOrOutputsForNonmaxSuppression(model));
    }
    return false;
}